

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

int __thiscall Expr::MinimalHeaderSize(Expr *this,Env *env)

{
  FieldType FVar1;
  pointer ppCVar2;
  CaseExpr *pCVar3;
  Expr *this_00;
  pointer ppEVar4;
  ID *pIVar5;
  bool bVar6;
  IDType IVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  LetField *f;
  ExprList *pEVar12;
  RecordField *pRVar13;
  AttrList *pAVar14;
  undefined4 extraout_var;
  Type *pTVar15;
  Exception *this_01;
  ExceptionIDNotField *this_02;
  int i;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int local_5c;
  RecordField *local_58;
  string local_50;
  
  uVar8 = 0xffffffff;
LAB_00118b85:
  FVar1 = (((RecordField *)this)->super_Field).tof_;
  switch(FVar1) {
  case CASE_FIELD:
    pIVar5 = (ID *)(((RecordField *)this)->super_Field).field_id_str_._M_dataplus._M_p;
    IVar7 = Env::GetIDType(env,pIVar5);
    if (FUNC_PARAM < IVar7) {
      return 0xffffffff;
    }
    if ((0x18U >> (IVar7 & 0x1f) & 1) == 0) {
      if (IVar7 != MACRO) {
        if ((0x347U >> (IVar7 & 0x1f) & 1) == 0) {
          return 0xffffffff;
        }
        goto switchD_00118b99_caseD_1;
      }
      this = Env::GetMacro(env,pIVar5);
      goto LAB_00118b85;
    }
    pRVar13 = (RecordField *)Env::GetField(env,pIVar5);
    if (pRVar13 == (RecordField *)0x0) {
      this_02 = (ExceptionIDNotField *)__cxa_allocate_exception(0x28);
      ExceptionIDNotField::ExceptionIDNotField(this_02,pIVar5);
      __cxa_throw(this_02,&ExceptionIDNotField::typeinfo,Exception::~Exception);
    }
    switch((pRVar13->super_Field).tof_) {
    case CASE_FIELD:
      pTVar15 = (pRVar13->super_Field).type_;
      uVar8 = (*(pTVar15->super_DataDepElement)._vptr_DataDepElement[0x13])(pTVar15,env);
      if ((int)uVar8 < 0) {
        return 0xffffffff;
      }
      return uVar8;
    default:
      goto switchD_00118bda_caseD_1;
    case LET_FIELD:
      this = (Expr *)pRVar13->prev_;
      goto LAB_00118b85;
    case PADDING_FIELD:
    case RECORD_FIELD:
      break;
    case PARAM_FIELD:
    case PARSE_VAR_FIELD:
    case PRIV_VAR_FIELD:
    case PUB_VAR_FIELD:
    case TEMP_VAR_FIELD:
      goto switchD_00118b99_caseD_1;
    }
    break;
  case CONTEXT_FIELD:
switchD_00118b99_caseD_1:
    uVar8 = 0;
switchD_00118bda_caseD_1:
    return uVar8;
  case FLOW_FIELD:
  case LET_FIELD:
  case RECORD_FIELD:
  case PARSE_VAR_FIELD:
    goto switchD_00118b99_caseD_2;
  case PADDING_FIELD:
    pTVar15 = DataType((Expr *)(((RecordField *)this)->super_Field).id_,env);
    iVar11 = (*(pTVar15->super_DataDepElement)._vptr_DataDepElement[0xe])(pTVar15);
    iVar11 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar11) + 0x98))
                       ((long *)CONCAT44(extraout_var,iVar11),env);
    if (iVar11 < 0) {
      return 0xffffffff;
    }
    bVar6 = ConstFold((Expr *)(((RecordField *)this)->super_Field).type_,env,&local_5c);
    if (!bVar6) {
      return 0xffffffff;
    }
    return iVar11 * local_5c;
  case PARAM_FIELD:
    goto switchD_00118b99_caseD_5;
  case PRIV_VAR_FIELD:
    pAVar14 = (((RecordField *)this)->super_Field).attrs_;
    if (pAVar14 == (AttrList *)0x0) {
      return 0;
    }
    uVar18 = 0;
    uVar8 = 0;
    while( true ) {
      ppEVar4 = (((_Vector_base<Expr_*,_std::allocator<Expr_*>_> *)
                 &pAVar14->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)->_M_impl).
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(((_Vector_base<Expr_*,_std::allocator<Expr_*>_> *)
                         &pAVar14->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)->_M_impl).
                        super__Vector_impl_data._M_finish - (long)ppEVar4 >> 3) <= (ulong)uVar18)
      break;
      uVar10 = MinimalHeaderSize(ppEVar4[uVar18],env);
      uVar16 = uVar10;
      if ((int)uVar10 < (int)uVar8) {
        uVar16 = uVar8;
      }
      if ((int)(uVar10 | uVar8) < 0) {
        uVar16 = 0xffffffff;
      }
      uVar18 = uVar18 + 1;
      pAVar14 = (((RecordField *)this)->super_Field).attrs_;
      uVar8 = uVar16;
    }
    return uVar8;
  case PUB_VAR_FIELD:
    pIVar5 = ((Expr *)(((RecordField *)this)->super_Field).id_)->id_;
    pRVar13 = anon_unknown.dwarf_822b7::GetRecordField(pIVar5,env);
    if (pRVar13 == (RecordField *)0x0) {
      pTVar15 = TypeDecl::LookUpType(pIVar5);
      if (pTVar15 != (Type *)0x0) {
        return 0;
      }
      this_01 = (Exception *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"not a record field or type",(allocator<char> *)&local_5c);
      Exception::Exception(this_01,&pIVar5->super_Object,&local_50);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
    iVar11 = (*(pRVar13->super_Field).super_DataDepElement._vptr_DataDepElement[0xc])
                       (pRVar13,env,0xffffffffffffffff);
    if (-1 < iVar11) {
      return 0;
    }
    break;
  case TEMP_VAR_FIELD:
    pRVar13 = anon_unknown.dwarf_822b7::GetRecordField
                        (((Expr *)(((RecordField *)this)->super_Field).id_)->id_,env);
    if (-1 < pRVar13->static_offset_) {
      return pRVar13->static_offset_;
    }
    pRVar13 = pRVar13->prev_;
    break;
  default:
    if (FVar1 == 0x21) {
      local_58 = (RecordField *)this;
      uVar8 = MinimalHeaderSize((Expr *)(((RecordField *)this)->super_Field).id_,env);
      uVar18 = 0;
      while( true ) {
        ppCVar2 = (((_Vector_impl *)&(local_58->record_type_->super_Type).super_DataDepElement)->
                  super__Vector_impl_data)._M_start;
        if ((ulong)((long)(((_Vector_impl *)
                           &(local_58->record_type_->super_Type).super_DataDepElement)->
                          super__Vector_impl_data)._M_finish - (long)ppCVar2 >> 3) <= (ulong)uVar18)
        break;
        pCVar3 = ppCVar2[uVar18];
        pEVar12 = pCVar3->index_;
        if (pEVar12 != (ExprList *)0x0) {
          uVar16 = 0;
          while( true ) {
            lVar17 = *(long *)&(pEVar12->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                               _M_impl.super__Vector_impl_data;
            if ((ulong)((long)(pEVar12->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl
                              .super__Vector_impl_data._M_finish - lVar17 >> 3) <= (ulong)uVar16)
            break;
            uVar9 = MinimalHeaderSize(*(Expr **)(lVar17 + (ulong)uVar16 * 8),env);
            uVar10 = uVar9;
            if ((int)uVar9 < (int)uVar8) {
              uVar10 = uVar8;
            }
            uVar9 = uVar9 | uVar8;
            uVar8 = uVar10;
            if ((int)uVar9 < 0) {
              uVar8 = 0xffffffff;
            }
            uVar16 = uVar16 + 1;
            pEVar12 = pCVar3->index_;
          }
        }
        uVar10 = MinimalHeaderSize(pCVar3->value_,env);
        uVar16 = uVar10;
        if ((int)uVar10 < (int)uVar8) {
          uVar16 = uVar8;
        }
        uVar10 = uVar10 | uVar8;
        uVar8 = uVar16;
        if ((int)uVar10 < 0) {
          uVar8 = 0xffffffff;
        }
        uVar18 = uVar18 + 1;
      }
      return uVar8;
    }
switchD_00118b99_caseD_2:
    uVar8 = 0;
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      this_00 = (Expr *)(&(((RecordField *)this)->super_Field).id_)[lVar17];
      if (this_00 != (Expr *)0x0) {
        uVar16 = MinimalHeaderSize(this_00,env);
        uVar18 = uVar16;
        if ((int)uVar16 < (int)uVar8) {
          uVar18 = uVar8;
        }
        uVar16 = uVar16 | uVar8;
        uVar8 = uVar18;
        if ((int)uVar16 < 0) {
          uVar8 = 0xffffffff;
        }
      }
    }
    return uVar8;
  }
  iVar11 = anon_unknown.dwarf_822b7::mhs_recordfield(env,pRVar13);
  return iVar11;
switchD_00118b99_caseD_5:
  this = (Expr *)(((RecordField *)this)->super_Field).id_;
  goto LAB_00118b85;
}

Assistant:

int Expr::MinimalHeaderSize(Env* env)
	{
	int mhs;

	switch ( expr_type_ )
		{
		case EXPR_NUM:
			// Zero byte is required
			mhs = 0;
			break;

		case EXPR_ID:
			mhs = mhs_id(env, id_);
			break;

		case EXPR_MEMBER:
			// TODO: this is not a tight bound because
			// one actually does not have to parse the
			// whole record to compute one particular
			// field.
			mhs = operand_[0]->MinimalHeaderSize(env);
			break;

		case EXPR_SUBSCRIPT:
			{
			int index;
			Type* array_type = operand_[0]->DataType(env);
			Type* elem_type = array_type->ElementDataType();
			int elem_size = elem_type->StaticSize(env);
			if ( elem_size >= 0 && operand_[1]->ConstFold(env, &index) )
				{
				mhs = elem_size * index;
				}
			else
				{
				mhs = -1;
				}
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* rf;
			Type* ty;

			if ( (rf = GetRecordField(id, env)) != nullptr )
				{
				if ( rf->StaticSize(env, -1) >= 0 )
					mhs = 0;
				else
					mhs = mhs_recordfield(env, rf);
				}

			else if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
				{
				mhs = 0;
				}

			else
				throw Exception(id, "not a record field or type");
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* field = GetRecordField(id, env);

			mhs = field->static_offset();
			if ( mhs < 0 )
				{
				mhs = 0;
				// Take the MHS of the preceding (non-let) field
				RecordField* prev_field = field->prev();
				ASSERT(prev_field);
				mhs = mhs_recordfield(env, prev_field);
				}
			}
			break;

		case EXPR_CALLARGS:
			{
			mhs = 0;
			if ( args_ )
				for ( unsigned int i = 0; i < args_->size(); ++i )
					mhs = mhs_max(mhs, (*args_)[i]->MinimalHeaderSize(env));
			}
			break;
		case EXPR_CASE:
			{
			mhs = operand_[0]->MinimalHeaderSize(env);
			for ( unsigned int i = 0; i < cases_->size(); ++i )
				{
				CaseExpr* ce = (*cases_)[i];
				if ( ce->index() )
					for ( unsigned int j = 0; j < ce->index()->size(); ++j )
						mhs = mhs_max(mhs, (*ce->index())[j]->MinimalHeaderSize(env));
				mhs = mhs_max(mhs, ce->value()->MinimalHeaderSize(env));
				}
			}
			break;
		default:
			// Evaluate every operand by default
			mhs = 0;
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					mhs = mhs_max(mhs, operand_[i]->MinimalHeaderSize(env));
			break;
		}

	return mhs;
	}